

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O0

string * __thiscall
tinyusdz::crate::ValueRep::GetStringRepr_abi_cxx11_(string *__return_storage_ptr__,ValueRep *this)

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  ostream *poVar4;
  uint64_t uVar5;
  int32_t type_id;
  string local_1c0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream aoStack_190 [376];
  ValueRep *local_18;
  ValueRep *this_local;
  
  local_18 = this;
  this_local = (ValueRep *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  poVar4 = ::std::operator<<(aoStack_190,"ty: ");
  iVar2 = GetType(this);
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,iVar2);
  poVar4 = ::std::operator<<(poVar4,"(");
  uVar3 = GetType(this);
  GetCrateDataTypeName_abi_cxx11_(&local_1c0,(crate *)(ulong)uVar3,type_id);
  poVar4 = ::std::operator<<(poVar4,(string *)&local_1c0);
  poVar4 = ::std::operator<<(poVar4,"), isArray: ");
  bVar1 = IsArray(this);
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,bVar1);
  poVar4 = ::std::operator<<(poVar4,", isInlined: ");
  bVar1 = IsInlined(this);
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,bVar1);
  poVar4 = ::std::operator<<(poVar4,", isCompressed: ");
  bVar1 = IsCompressed(this);
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,bVar1);
  poVar4 = ::std::operator<<(poVar4,", payload: ");
  uVar5 = GetPayload(this);
  ::std::ostream::operator<<(poVar4,uVar5);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GetStringRepr() const {
    std::stringstream ss;
    ss << "ty: " << static_cast<int>(GetType()) << "(" << GetCrateDataTypeName(GetType()) << "), isArray: " << IsArray()
       << ", isInlined: " << IsInlined() << ", isCompressed: " << IsCompressed()
       << ", payload: " << GetPayload();

    return ss.str();
  }